

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

BaseType_conflict
Imath_3_2::(anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<double>>(Matrix44<double> *A)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = 0.0;
  for (lVar2 = 0; lVar3 = 1, lVar2 != 4; lVar2 = lVar2 + 1) {
    for (; lVar2 + lVar3 != 4; lVar3 = lVar3 + 1) {
      dVar1 = ABS(*(double *)((long)A + lVar3 * 8));
      if (ABS(*(double *)((long)A + lVar3 * 8)) <= dVar4) {
        dVar1 = dVar4;
      }
      dVar4 = dVar1;
    }
    A = (Matrix44<double> *)((long)A + 0x28);
  }
  return dVar4;
}

Assistant:

IMATH_CONSTEXPR14 inline typename TM::BaseType
maxOffDiagSymm (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             result = 0;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = i + 1; j < TM::dimensions (); ++j)
            result = std::max (result, std::abs (A[i][j]));

    return result;
}